

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
::split(btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
        *this,int insert_position,
       btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
       *dest,allocator_type *alloc)

{
  btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  bVar1;
  btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *pbVar2;
  uint i;
  size_type i_00;
  ulong uVar3;
  long lVar4;
  btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *local_38;
  
  if (((ulong)dest & 7) == 0) {
    if (dest[10] !=
        (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
         )0x0) {
      __assert_fail("dest->count() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x8fb,
                    "void phmap::priv::btree_node<phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>]"
                   );
    }
    if (((ulong)this & 7) == 0) {
      if ((this[0xb] !=
           (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
            )0x0) &&
         (this[0xb] !=
          (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
           )0x6)) {
        __assert_fail("max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x8fc,
                      "void phmap::priv::btree_node<phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>]"
                     );
      }
      if (insert_position == 6) {
        bVar1 = (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 )0x0;
      }
      else if (insert_position == 0) {
        bVar1 = (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 )((char)this[10] - 1);
      }
      else {
        bVar1 = (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 )((byte)this[10] >> 1);
      }
      dest[10] = bVar1;
      bVar1 = (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
               )((char)this[10] - (char)bVar1);
      this[10] = bVar1;
      if (bVar1 != (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                    )0x0) {
        uninitialized_move_n(this,(ulong)(byte)dest[10],(ulong)(byte)bVar1,0,dest,alloc);
        bVar1 = this[10];
        uVar3 = (ulong)(byte)dest[10];
        if (uVar3 != 0) {
          i_00 = (size_type)(byte)bVar1;
          do {
            value_destroy(this,i_00,alloc);
            i_00 = i_00 + 1;
            uVar3 = uVar3 - 1;
          } while (uVar3 != 0);
          bVar1 = this[10];
        }
        this[10] = (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                    )((char)bVar1 - 1U);
        local_38 = this + (ulong)(byte)((char)bVar1 - 1U) * 0x28 + 0x10;
        btree_node<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
        ::emplace_value<std::tuple<float,std::__cxx11::string>*>
                  (*(btree_node<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
                     **)this,(ulong)(byte)this[8],alloc,
                   (tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    **)&local_38);
        value_destroy(this,(ulong)(byte)this[10],alloc);
        init_child(*(btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                     **)this,(byte)this[8] + 1,dest);
        if (this[0xb] ==
            (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
             )0x0) {
          i = 0xffffffff;
          lVar4 = 1;
          do {
            pbVar2 = child(this,(ulong)(byte)this[10] + lVar4);
            if (pbVar2 == (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                           *)0x0) {
              __assert_fail("child(count() + i + 1) != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x91a,
                            "void phmap::priv::btree_node<phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>]"
                           );
            }
            i = i + 1;
            pbVar2 = child(this,(ulong)(byte)this[10] + lVar4);
            init_child(dest,i,pbVar2);
            mutable_child(this,(ulong)(byte)this[10] + lVar4);
            lVar4 = lVar4 + 1;
          } while (i < (byte)dest[10]);
        }
        return;
      }
      __assert_fail("count() >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x90a,
                    "void phmap::priv::btree_node<phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>]"
                   );
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>> *, unsigned char, std::tuple<float, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>> *, unsigned char, std::tuple<float, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::set_params<std::tuple<float, std::basic_string<char>>, phmap::Less<std::tuple<float, std::basic_string<char>>>, std::allocator<std::tuple<float, std::basic_string<char>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                              allocator_type *alloc) {
        assert(dest->count() == 0);
        assert(max_count() == kNodeValues);

        // We bias the split based on the position being inserted. If we're
        // inserting at the beginning of the left node then bias the split to put
        // more values on the right node. If we're inserting at the end of the
        // right node then bias the split to put more values on the left node.
        if (insert_position == 0) {
            dest->set_count((field_type)(count() - 1));
        } else if (insert_position == kNodeValues) {
            dest->set_count(0);
        } else {
            dest->set_count((field_type)(count() / 2));
        }
        set_count((field_type)(count() - dest->count()));
        assert(count() >= 1);

        // Move values from the left sibling to the right sibling.
        uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

        // Destroy the now-empty entries in the left node.
        value_destroy_n(count(), dest->count(), alloc);

        // The split key is the largest value in the left sibling.
        set_count((field_type)(count() - 1));
        parent()->emplace_value(position(), alloc, slot(count()));
        value_destroy(count(), alloc);
        parent()->init_child(position() + 1, dest);

        if (!leaf()) {
            for (int i = 0; i <= dest->count(); ++i) {
                assert(child(count() + i + 1) != nullptr);
                dest->init_child(i, child(count() + i + 1));
                clear_child(count() + i + 1);
            }
        }
    }